

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperOneofFieldGenerator::GenerateMembers
          (WrapperOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  variables = &(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.variables_;
  io::Printer::Print(printer,variables,
                     "private static readonly pb::FieldCodec<$type_name$> _oneof_$name$_codec = ");
  (*(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.super_SourceGeneratorBase.
    _vptr_SourceGeneratorBase[4])(this,printer);
  io::Printer::Print<>(printer,";\n");
  WritePropertyDocComment
            (printer,(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
  io::Printer::Print(printer,variables,
                     "$access_level$ $type_name$ $property_name$ {\n  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : ($type_name$) null; }\n  set {\n    $oneof_name$_ = value;\n    $oneof_name$Case_ = value == null ? $oneof_property_name$OneofCase.None : $oneof_property_name$OneofCase.$property_name$;\n  }\n}\n"
                    );
  pFVar1 = (this->super_WrapperFieldGenerator).super_FieldGeneratorBase.descriptor_;
  if ((~(byte)pFVar1[1] & 0x60) != 0) {
    if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = pFVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar1 + 0x18),&local_28,&local_30);
    }
    if ((pFVar1[2] != (FieldDescriptor)0xb) &&
       ((*(char *)(*(long *)(pFVar1 + 0x10) + 0x3a) == '\x02' || (((byte)pFVar1[1] & 2) != 0)))) {
      io::Printer::Print(printer,variables,
                         "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n"
                        );
      FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
      io::Printer::Print(printer,variables,
                         "$access_level$ bool Has$property_name$ {\n  get { return $oneof_name$Case_ == $oneof_property_name$OneofCase.$property_name$; }\n}\n"
                        );
      io::Printer::Print(printer,variables,
                         "/// <summary> Clears the value of the oneof if it\'s currently set to \"$descriptor_name$\" </summary>\n"
                        );
      FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
      io::Printer::Print(printer,variables,
                         "$access_level$ void Clear$property_name$() {\n  if ($has_property_check$) {\n    Clear$oneof_property_name$();\n  }\n}\n"
                        );
    }
  }
  return;
}

Assistant:

void WrapperOneofFieldGenerator::GenerateMembers(io::Printer* printer) {
  // Note: deliberately _oneof_$name$_codec, not _$oneof_name$_codec... we have one codec per field.
  printer->Print(
        variables_,
        "private static readonly pb::FieldCodec<$type_name$> _oneof_$name$_codec = ");
  GenerateCodecCode(printer);
  printer->Print(";\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : ($type_name$) null; }\n"
    "  set {\n"
    "    $oneof_name$_ = value;\n"
    "    $oneof_name$Case_ = value == null ? $oneof_property_name$OneofCase.None : $oneof_property_name$OneofCase.$property_name$;\n"
    "  }\n"
    "}\n");
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(
      variables_,
      "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ bool Has$property_name$ {\n"
      "  get { return $oneof_name$Case_ == $oneof_property_name$OneofCase.$property_name$; }\n"
      "}\n");
    printer->Print(
      variables_,
      "/// <summary> Clears the value of the oneof if it's currently set to \"$descriptor_name$\" </summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ void Clear$property_name$() {\n"
      "  if ($has_property_check$) {\n"
      "    Clear$oneof_property_name$();\n"
      "  }\n"
      "}\n");
  }
}